

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall
QtPrivate::QColorLuminancePicker::paintEvent(QColorLuminancePicker *this,QPaintEvent *param_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  QWidgetData *pQVar7;
  uint __tmp;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  long lVar11;
  QPixmap *pQVar12;
  QPalette *pal;
  long lVar13;
  int iVar14;
  int iVar15;
  long in_FS_OFFSET;
  int iVar16;
  QRect local_78;
  QPainter p;
  undefined8 local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = (this->super_QWidget).data;
  local_78.x1.m_i = 0;
  local_78.y1.m_i = 3;
  uVar1 = (pQVar7->crect).x2;
  uVar3 = (pQVar7->crect).y2;
  uVar2 = (pQVar7->crect).x1;
  uVar4 = (pQVar7->crect).y1;
  iVar16 = uVar1 - uVar2;
  local_78.x2.m_i = iVar16 + -5;
  local_78.y2.m_i = (uVar3 - uVar4) + -3;
  iVar14 = iVar16 + -6;
  iVar15 = (uVar3 - uVar4) + -7;
  if (this->pix != (QPixmap *)0x0) {
    iVar8 = QPixmap::height();
    if (iVar8 == iVar15) {
      iVar8 = QPixmap::width();
      if (iVar8 == iVar14) goto LAB_0048b696;
    }
    if (this->pix != (QPixmap *)0x0) {
      (**(code **)(*(long *)this->pix + 8))();
    }
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)&local_58,iVar14,iVar15,Format_RGB32);
  iVar8 = 0;
  lVar11 = QImage::scanLine((int)(QImage *)&local_58);
  if (iVar15 < 1) {
    iVar15 = iVar8;
  }
  for (; iVar8 != iVar15; iVar8 = iVar8 + 1) {
    iVar5 = this->hue;
    iVar6 = this->sat;
    iVar9 = y2val(this,iVar8 + 4);
    _p = (QPoint)QColor::fromHsv(iVar5,iVar6,iVar9,0xff);
    uVar10 = QColor::rgb();
    for (lVar13 = 0; (long)iVar14 * 4 != lVar13; lVar13 = lVar13 + 4) {
      *(undefined4 *)(lVar11 + lVar13) = uVar10;
    }
    lVar11 = lVar11 + (long)iVar14 * 4;
  }
  pQVar12 = (QPixmap *)operator_new(0x18);
  QPixmap::fromImage(pQVar12,(QImage *)&local_58,0);
  this->pix = pQVar12;
  QImage::~QImage((QImage *)&local_58);
LAB_0048b696:
  _p = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter(&p,&(this->super_QWidget).super_QPaintDevice);
  QPainter::drawPixmap(&p,1,4,this->pix);
  pal = QWidget::palette(&this->super_QWidget);
  qDrawShadePanel(&p,&local_78,pal,true,1,(QBrush *)0x0);
  QPalette::windowText(pal);
  QPainter::setPen((QColor *)&p);
  QPalette::windowText(pal);
  QPainter::setBrush((QBrush *)&p);
  pQVar7 = (this->super_QWidget).data;
  QPainter::eraseRect(&p,iVar16 + -4,0,5,((pQVar7->crect).y2.m_i - (pQVar7->crect).y1.m_i) + 1);
  iVar15 = val2y(this,this->val);
  local_58 = (undefined1 *)CONCAT44(iVar15,iVar16 + -4);
  puStack_50 = (undefined1 *)CONCAT44(iVar15 + 5,iVar16 + 1);
  local_48 = (undefined1 *)CONCAT44(iVar15 + -5,iVar16 + 1);
  QPainter::drawPolygon((QPoint *)&p,(int)&local_58,3);
  QPainter::~QPainter(&p);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorLuminancePicker::paintEvent(QPaintEvent *)
{
    int w = width() - 5;

    QRect r(0, foff, w, height() - 2*foff);
    int wi = r.width() - 2;
    int hi = r.height() - 2;
    if (!pix || pix->height() != hi || pix->width() != wi) {
        delete pix;
        QImage img(wi, hi, QImage::Format_RGB32);
        int y;
        uint *pixel = (uint *) img.scanLine(0);
        for (y = 0; y < hi; y++) {
            uint *end = pixel + wi;
            std::fill(pixel, end, QColor::fromHsv(hue, sat, y2val(y + coff)).rgb());
            pixel = end;
        }
        pix = new QPixmap(QPixmap::fromImage(img));
    }
    QPainter p(this);
    p.drawPixmap(1, coff, *pix);
    const QPalette &g = palette();
    qDrawShadePanel(&p, r, g, true);
    p.setPen(g.windowText().color());
    p.setBrush(g.windowText());
    p.eraseRect(w, 0, 5, height());
    const int y = val2y(val);
    const std::array<QPoint, 3> points = {QPoint(w, y), QPoint(w + 5, y + 5), QPoint(w + 5, y - 5)};
    p.drawPolygon(points.data(), static_cast<int>(points.size()));
}